

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseDocument(htmlParserCtxtPtr ctxt)

{
  setDocumentLocatorSAXFunc p_Var1;
  startDocumentSAXFunc p_Var2;
  xmlParserInputPtr pxVar3;
  __int32_t *p_Var4;
  endDocumentSAXFunc p_Var5;
  int iVar6;
  __int32_t **pp_Var7;
  xmlDtdPtr pxVar8;
  int iVar9;
  xmlChar *pxVar10;
  
  iVar6 = -1;
  if ((ctxt != (htmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var1 = ctxt->sax->setDocumentLocator, p_Var1 != (setDocumentLocatorSAXFunc)0x0)) {
      (*p_Var1)(ctxt->userData,&xmlDefaultSAXLocator);
    }
    xmlDetectEncoding(ctxt);
    if (((ctxt->input->flags & 1) == 0) &&
       (iVar6 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar6 == 0)) {
      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
    }
    htmlSkipBlankChars(ctxt);
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var2 = ctxt->sax->startDocument, p_Var2 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var2)(ctxt->userData);
    }
    while( true ) {
      pxVar3 = ctxt->input;
      pxVar10 = pxVar3->cur;
      if (*pxVar10 != '<') break;
      if (pxVar10[1] == '?') {
        pxVar10 = pxVar10 + 1;
        iVar9 = 1;
        iVar6 = iVar9;
      }
      else {
        if (pxVar10[1] != '!') break;
        if ((pxVar10[2] != '-') || (pxVar10[3] != '-')) {
          pp_Var7 = __ctype_toupper_loc();
          p_Var4 = *pp_Var7;
          if ((((p_Var4[pxVar10[2]] == 0x44) &&
               ((p_Var4[pxVar10[3]] == 0x4f && (p_Var4[pxVar10[4]] == 0x43)))) &&
              (p_Var4[pxVar10[5]] == 0x54)) &&
             (((p_Var4[pxVar10[6]] == 0x59 && (p_Var4[pxVar10[7]] == 0x50)) &&
              (p_Var4[pxVar10[8]] == 0x45)))) {
            ctxt->instate = XML_PARSER_MISC;
            htmlParseDocTypeDecl(ctxt);
          }
          break;
        }
        pxVar10 = pxVar10 + 4;
        iVar9 = 4;
        iVar6 = 0;
      }
      pxVar3->cur = pxVar10;
      pxVar3->col = pxVar3->col + iVar9;
      htmlParseComment(ctxt,iVar6);
      htmlSkipBlankChars(ctxt);
    }
    htmlSkipBlankChars(ctxt);
    ctxt->instate = XML_PARSER_PROLOG;
    while( true ) {
      pxVar3 = ctxt->input;
      pxVar10 = pxVar3->cur;
      if (*pxVar10 != '<') break;
      if (pxVar10[1] == '?') {
        pxVar10 = pxVar10 + 1;
        iVar9 = 1;
        iVar6 = iVar9;
      }
      else {
        if (((pxVar10[1] != '!') || (pxVar10[2] != '-')) || (pxVar10[3] != '-')) break;
        pxVar10 = pxVar10 + 4;
        iVar9 = 4;
        iVar6 = 0;
      }
      pxVar3->cur = pxVar10;
      pxVar3->col = pxVar3->col + iVar9;
      htmlParseComment(ctxt,iVar6);
      htmlSkipBlankChars(ctxt);
    }
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);
    if (*ctxt->input->cur == '\0') {
      htmlAutoCloseOnEnd(ctxt);
    }
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var5 = ctxt->sax->endDocument, p_Var5 != (endDocumentSAXFunc)0x0)) {
      (*p_Var5)(ctxt->userData);
    }
    if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
       (pxVar8 = xmlGetIntSubset(ctxt->myDoc), pxVar8 == (xmlDtdPtr)0x0)) {
      pxVar8 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                  (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                  (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar8;
      if (pxVar8 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
    }
    iVar6 = -(uint)(ctxt->wellFormed == 0);
  }
  return iVar6;
}

Assistant:

int
htmlParseDocument(htmlParserCtxtPtr ctxt) {
    xmlDtdPtr dtd;

    if ((ctxt == NULL) || (ctxt->input == NULL))
	return(-1);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    /*
     * TODO: Implement HTML5 prescan algorithm
     */

    /*
     * This is wrong but matches long-standing behavior. In most
     * cases, a document starting with an XML declaration will
     * specify UTF-8. The HTML5 prescan algorithm handles
     * XML declarations in a better way.
     */
    if (((ctxt->input->flags & XML_INPUT_HAS_ENCODING) == 0) &&
        (xmlStrncmp(ctxt->input->cur, BAD_CAST "<?xm", 4) == 0))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_UTF8);

    /*
     * Wipe out everything which is before the first '<'
     */
    SKIP_BLANKS;

    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
	ctxt->sax->startDocument(ctxt->userData);

    /*
     * Parse possible comments and PIs before any content
     */
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    if ((CUR == '<') && (NXT(1) == '!') &&
	(UPP(2) == 'D') && (UPP(3) == 'O') &&
	(UPP(4) == 'C') && (UPP(5) == 'T') &&
	(UPP(6) == 'Y') && (UPP(7) == 'P') &&
	(UPP(8) == 'E')) {
        ctxt->instate = XML_PARSER_MISC;
	htmlParseDocTypeDecl(ctxt);
    }
    SKIP_BLANKS;

    /*
     * Parse possible comments and PIs before any content
     */
    ctxt->instate = XML_PARSER_PROLOG;
    while (CUR == '<') {
        if ((NXT(1) == '!') && (NXT(2) == '-') && (NXT(3) == '-')) {
            SKIP(4);
            htmlParseComment(ctxt, /* bogus */ 0);
        } else if (NXT(1) == '?') {
            SKIP(1);
            htmlParseComment(ctxt, /* bogus */ 1);
        } else {
            break;
        }
	SKIP_BLANKS;
    }

    /*
     * Time to start parsing the tree itself
     */
    ctxt->instate = XML_PARSER_CONTENT;
    htmlParseContent(ctxt);

    /*
     * autoclose
     */
    if (CUR == 0)
	htmlAutoCloseOnEnd(ctxt);


    /*
     * SAX: end of the document processing.
     */
    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
        ctxt->sax->endDocument(ctxt->userData);

    if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) && (ctxt->myDoc != NULL)) {
	dtd = xmlGetIntSubset(ctxt->myDoc);
	if (dtd == NULL) {
	    ctxt->myDoc->intSubset =
		xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
		    BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
		    BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
            if (ctxt->myDoc->intSubset == NULL)
                htmlErrMemory(ctxt);
        }
    }
    if (! ctxt->wellFormed) return(-1);
    return(0);
}